

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O3

void __thiscall Liby::UdpSocket::handleErroEvent(UdpSocket *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  this_00 = (this->self_).super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if ((this->erroEventCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->erroEventCallback_)._M_invoker)((_Any_data *)&this->erroEventCallback_,this);
  }
  destroy(this);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void UdpSocket::handleErroEvent() {
    auto self = self_;
    if (erroEventCallback_) {
        erroEventCallback_(*this);
    }
    destroy();
}